

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::asio_rpc_client::set_busy_flag(asio_rpc_client *this,bool to)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  bool exp;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,to) == 0) {
    exp = true;
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      (&this->socket_busy_,&exp,false,memory_order_seq_cst);
    if (bVar2) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar3 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar3 < 1) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_38,"socket %p is already idle, race happened on connection to %s:%s",this,
               (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"set_busy_flag",0x4fb,&local_38);
  }
  else {
    exp = false;
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      (&this->socket_busy_,&exp,true,memory_order_seq_cst);
    if (bVar2) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar3 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar3 < 1) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_38,"socket %p is already in use, race happened on connection to %s:%s",this,
               (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"set_busy_flag",0x4f4,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void set_busy_flag(bool to) {
        if (to == true) {
            bool exp = false;
            if (!socket_busy_.compare_exchange_strong(exp, true)) {
                p_ft("socket %p is already in use, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        } else {
            bool exp = true;
            if (!socket_busy_.compare_exchange_strong(exp, false)) {
                p_ft("socket %p is already idle, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        }
    }